

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

unit_data __thiscall units::detail::unit_data::operator*(unit_data *this,unit_data *other)

{
  unit_data uVar1;
  unit_data uVar2;
  undefined8 in_RAX;
  uint uVar3;
  unit_data local_34;
  
  local_34 = SUB84((ulong)in_RAX >> 0x20,0);
  uVar1 = *this;
  uVar2 = *other;
  uVar3 = (uint)uVar2 | (uint)uVar1;
  unit_data(&local_34,(((int)uVar2 << 0x1c) >> 0x1c) + (((int)uVar1 << 0x1c) >> 0x1c),
            (((int)uVar2 << 0x15) >> 0x1d) + (((int)uVar1 << 0x15) >> 0x1d),
            ((int)uVar2._0_1_ >> 4) + ((int)uVar1._0_1_ >> 4),
            (((int)uVar2 << 0x12) >> 0x1d) + (((int)uVar1 << 0x12) >> 0x1d),
            (((int)uVar2 << 0xd) >> 0x1d) + (((int)uVar1 << 0xd) >> 0x1d),
            (((int)uVar2 << 0xb) >> 0x1e) + (((int)uVar1 << 0xb) >> 0x1e),
            ((int)uVar2._0_2_ >> 0xe) + ((int)uVar1._0_2_ >> 0xe),
            (((int)uVar2 << 6) >> 0x1e) + (((int)uVar1 << 6) >> 0x1e),
            (((int)uVar2 << 4) >> 0x1e) + (((int)uVar1 << 4) >> 0x1e),
            (((int)uVar2 << 8) >> 0x1d) + (((int)uVar1 << 8) >> 0x1d),uVar3 >> 0x1c & 1,
            ((uint)uVar2 ^ (uint)uVar1) >> 0x1d & 1,uVar3 >> 0x1e & 1,uVar3 >> 0x1f);
  return local_34;
}

Assistant:

constexpr unit_data operator*(const unit_data& other) const
        {
            return {
                meter_ + other.meter_,
                kilogram_ + other.kilogram_,
                second_ + other.second_,
                ampere_ + other.ampere_,
                kelvin_ + other.kelvin_,
                mole_ + other.mole_,
                candela_ + other.candela_,
                currency_ + other.currency_,
                count_ + other.count_,
                radians_ + other.radians_,
                static_cast<unsigned int>(per_unit_ | other.per_unit_),
                static_cast<unsigned int>(i_flag_ ^ other.i_flag_),
                static_cast<unsigned int>(e_flag_ | other.e_flag_),
                static_cast<unsigned int>(equation_ | other.equation_),
            };
        }